

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O2

int __thiscall
xercesc_4_0::DOMAttrMapImpl::findNamePoint
          (DOMAttrMapImpl *this,XMLCh *namespaceURI,XMLCh *localName)

{
  XMLSize_t XVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DOMNode *pDVar5;
  XMLSize_t i;
  ulong uVar6;
  
  if (this->fNodes != (DOMNodeVector *)0x0) {
    XVar1 = this->fNodes->nextFreeSlot;
    for (uVar6 = 0; XVar1 != uVar6; uVar6 = uVar6 + 1) {
      if (uVar6 < this->fNodes->nextFreeSlot) {
        pDVar5 = this->fNodes->data[uVar6];
      }
      else {
        pDVar5 = (DOMNode *)0x0;
      }
      iVar3 = (*pDVar5->_vptr_DOMNode[0x16])(pDVar5);
      iVar4 = (*pDVar5->_vptr_DOMNode[0x18])(pDVar5);
      bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var,iVar3),namespaceURI);
      if (bVar2) {
        bVar2 = XMLString::equals(localName,(XMLCh *)CONCAT44(extraout_var_00,iVar4));
        if (bVar2) {
LAB_0026fa75:
          return (int)uVar6;
        }
        if ((XMLCh *)CONCAT44(extraout_var_00,iVar4) == (XMLCh *)0x0) {
          iVar3 = (*pDVar5->_vptr_DOMNode[2])(pDVar5);
          bVar2 = XMLString::equals(localName,(XMLCh *)CONCAT44(extraout_var_01,iVar3));
          if (bVar2) goto LAB_0026fa75;
        }
      }
    }
  }
  return -1;
}

Assistant:

int DOMAttrMapImpl::findNamePoint(const XMLCh *namespaceURI,
	const XMLCh *localName) const
{
    if (fNodes == 0)
	return -1;
    // This is a linear search through the same fNodes Vector.
    // The Vector is sorted on the DOM Level 1 nodename.
    // The DOM Level 2 NS keys are namespaceURI and Localname,
    // so we must linear search thru it.
    // In addition, to get this to work with fNodes without any namespace
    // (namespaceURI and localNames are both 0) we then use the nodeName
    // as a secondary key.
    const XMLSize_t len = fNodes -> size();
    for (XMLSize_t i = 0; i < len; ++i) {
        DOMNode *node = fNodes -> elementAt(i);
        const XMLCh * nNamespaceURI = node->getNamespaceURI();
        const XMLCh * nLocalName = node->getLocalName();
        if (!XMLString::equals(nNamespaceURI, namespaceURI))    //URI not match
            continue;
        else {
            if (XMLString::equals(localName, nLocalName)
                ||
                (nLocalName == 0 && XMLString::equals(localName, node->getNodeName())))
                return (int)i;
        }
    }
    return -1;	//not found
}